

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Value *other;
  ulong uVar7;
  byte *pbVar8;
  Value VStack_88;
  Value local_60;
  Value local_38;
  
  other = &VStack_88;
  cVar1 = *token->start_;
  uVar4 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  uVar5 = uVar4 / 10;
  pbVar8 = (byte *)(token->start_ + (cVar1 == '-'));
  uVar7 = 0;
  while (pbVar8 < token->end_) {
    bVar2 = *pbVar8;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0010738a:
      bVar3 = decodeDouble(this,token,decoded);
      return bVar3;
    }
    pbVar8 = pbVar8 + 1;
    uVar6 = (ulong)(bVar2 - 0x30);
    if ((uVar5 <= uVar7) &&
       (((uVar5 < uVar7 || (pbVar8 != (byte *)token->end_)) || (uVar4 % 10 < uVar6))))
    goto LAB_0010738a;
    uVar7 = uVar7 * 10 + uVar6;
  }
  if (cVar1 == '-') {
    uVar7 = -uVar7;
    other = &local_38;
  }
  else {
    if (0x7fffffff < uVar7) {
      VStack_88._8_2_ = 2;
      goto LAB_001073c7;
    }
    other = &local_60;
  }
  *(undefined2 *)&other->field_0x8 = 1;
LAB_001073c7:
  other->comments_ = (CommentInfo *)0x0;
  other->start_ = 0;
  other->limit_ = 0;
  (other->value_).int_ = uVar7;
  Value::swap(decoded,other);
  Value::~Value(other);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}